

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void api_dynamic_suite::dynamic_front(void)

{
  reference piVar1;
  initializer_list<int> input;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  int local_74 [3];
  type local_68 [6];
  circular_view<int,_18446744073709551615UL> local_50;
  
  local_50.member.data = local_68;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 4;
  local_74[0] = 0xb;
  local_74[1] = 0x16;
  local_74[2] = 0x21;
  input._M_len = 3;
  input._M_array = local_74;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_50,input);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front(&local_50);
  local_74[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd2,"void api_dynamic_suite::dynamic_front()",piVar1,local_74);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_50,1);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&local_50);
  *piVar1 = 0x2c;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front(&local_50);
  local_74[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd4,"void api_dynamic_suite::dynamic_front()",piVar1,local_74);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_50,1);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&local_50);
  *piVar1 = 0x37;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front(&local_50);
  local_74[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd6,"void api_dynamic_suite::dynamic_front()",piVar1,local_74);
  return;
}

Assistant:

void dynamic_front()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = {11, 22, 33};
    BOOST_TEST_EQ(span.front(), 11);
    span.push_back(44);
    BOOST_TEST_EQ(span.front(), 11);
    span.push_back(55);
    BOOST_TEST_EQ(span.front(), 22);
}